

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
TestSchema::readData<avro::Parser<avro::ReaderImpl<avro::Validator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::Validator>_> *p)

{
  bool bVar1;
  ostream *poVar2;
  Parser<avro::ReaderImpl<avro::Validator>_> *in_RDI;
  int32_t intval;
  bool boolval;
  int64_t longval;
  basic_cstring<const_char> *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  const_string *in_stack_fffffffffffffdc8;
  const_string *msg;
  size_t in_stack_fffffffffffffdd0;
  Parser<avro::ReaderImpl<avro::Validator>_> *line_num;
  const_string *in_stack_fffffffffffffdd8;
  basic_cstring<const_char> *this_00;
  unit_test_log_t *in_stack_fffffffffffffde0;
  unit_test_log_t *this_01;
  Parser<avro::ReaderImpl<avro::Validator>_> *in_stack_fffffffffffffde8;
  TestSchema *in_stack_fffffffffffffdf0;
  unsigned_long len;
  Parser<avro::ReaderImpl<avro::Validator>_> *in_stack_fffffffffffffdf8;
  Parser<avro::ReaderImpl<avro::Validator>_> *p_00;
  TestSchema *in_stack_fffffffffffffe00;
  basic_cstring<const_char> *this_02;
  char *pcVar3;
  TestSchema *this_03;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  Parser<avro::ReaderImpl<avro::Validator>_> *in_stack_fffffffffffffe58;
  TestSchema *in_stack_fffffffffffffe60;
  undefined1 local_198 [56];
  basic_cstring<const_char> local_160;
  int32_t local_14c;
  undefined1 local_148 [24];
  undefined1 local_130 [40];
  unit_test_log_t local_108 [2];
  basic_cstring<const_char> local_f8;
  undefined1 local_e1 [17];
  undefined1 local_d0 [56];
  basic_cstring<const_char> local_98;
  undefined1 local_81;
  basic_cstring<const_char> local_80;
  basic_cstring<const_char> local_70;
  undefined1 local_60 [56];
  basic_cstring<const_char> local_28;
  int64_t local_18 [3];
  
  printNext(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  avro::Parser<avro::ReaderImpl<avro::Validator>_>::readRecord
            ((Parser<avro::ReaderImpl<avro::Validator>_> *)0x2b4261);
  printNext(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_18[0] = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readLong
                          ((Parser<avro::ReaderImpl<avro::Validator>_> *)in_stack_fffffffffffffd90);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_18[0]);
  std::operator<<(poVar2,'\n');
  do {
    pcVar3 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
    ;
    this_03 = (TestSchema *)0x6b;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd90);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd98,(char (*) [1])in_stack_fffffffffffffd90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_70,pcVar3,(unsigned_long)this_03);
    local_80.m_begin._0_4_ = 1000;
    in_stack_fffffffffffffd98 = "1000";
    in_stack_fffffffffffffd90 = &local_80;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_60,&local_70,0x162,1,2,local_18,"longval");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2b43c9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  readMap<avro::Parser<avro::ReaderImpl<avro::Validator>>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  readArray<avro::Parser<avro::ReaderImpl<avro::Validator>>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  printNext(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_18[0] = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readEnum
                          ((Parser<avro::ReaderImpl<avro::Validator>_> *)0x2b4422);
  poVar2 = std::operator<<((ostream *)&std::cout,"Enum choice ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18[0]);
  std::operator<<(poVar2,'\n');
  printNext(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_18[0] = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readUnion
                          ((Parser<avro::ReaderImpl<avro::Validator>_> *)0x2b447c);
  poVar2 = std::operator<<((ostream *)&std::cout,"Union path ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18[0]);
  std::operator<<(poVar2,'\n');
  readMap<avro::Parser<avro::ReaderImpl<avro::Validator>>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  readNestedRecord<avro::Parser<avro::ReaderImpl<avro::Validator>>>
            (this_03,(Parser<avro::ReaderImpl<avro::Validator>_> *)pcVar3);
  printNext(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  local_81 = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readBool
                       ((Parser<avro::ReaderImpl<avro::Validator>_> *)in_stack_fffffffffffffd90);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(bool)local_81);
  std::operator<<(poVar2,'\n');
  do {
    this_02 = &local_98;
    p_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_02,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd90);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd98,(char (*) [1])in_stack_fffffffffffffd90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_e1 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_e1[0] = 1;
    in_stack_fffffffffffffd98 = "true";
    in_stack_fffffffffffffd90 = (basic_cstring<const_char> *)local_e1;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_d0,local_e1 + 1,0x175,1,2,&local_81,"boolval");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2b463c);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  printNext((TestSchema *)this_02,p_00);
  readFixed<avro::Parser<avro::ReaderImpl<avro::Validator>>>
            ((TestSchema *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),in_RDI);
  printNext((TestSchema *)this_02,p_00);
  local_18[0] = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readLong
                          ((Parser<avro::ReaderImpl<avro::Validator>_> *)in_stack_fffffffffffffd90);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_18[0]);
  std::operator<<(poVar2,'\n');
  do {
    pcVar3 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
    ;
    this_00 = &local_f8;
    len = 0x6b;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    this_01 = local_108;
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd90);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_01,this_00,(size_t)line_num,in_stack_fffffffffffffdc8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd98,(char (*) [1])in_stack_fffffffffffffd90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_148 + 8),pcVar3,len);
    local_148._0_8_ = (iterator)0x614b1cb2bfaa4383;
    in_stack_fffffffffffffd98 = "7010728798977672067LL";
    in_stack_fffffffffffffd90 = (basic_cstring<const_char> *)local_148;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long_long>
              (local_130,local_148 + 8,0x17d,1,2,local_18,"longval");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2b47c4);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  printNext((TestSchema *)this_02,p_00);
  local_14c = avro::Parser<avro::ReaderImpl<avro::Validator>_>::readInt
                        ((Parser<avro::ReaderImpl<avro::Validator>_> *)in_stack_fffffffffffffd90);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,local_14c);
  std::operator<<(poVar2,'\n');
  do {
    msg = (const_string *)0x6b;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffd90);
    boost::unit_test::unit_test_log_t::set_checkpoint(this_01,this_00,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd98,(char (*) [1])in_stack_fffffffffffffd90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&stack0xfffffffffffffe58,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,(unsigned_long)msg);
    in_stack_fffffffffffffd98 = "-3456";
    in_stack_fffffffffffffd90 = (basic_cstring<const_char> *)&stack0xfffffffffffffe54;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_198,&stack0xfffffffffffffe58,0x182,1,2,&local_14c,"intval");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x2b4919);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  avro::Parser<avro::ReaderImpl<avro::Validator>_>::readRecordEnd
            ((Parser<avro::ReaderImpl<avro::Validator>_> *)0x2b4933);
  return;
}

Assistant:

void readData(Parser &p)
    {
        printNext(p);
        p.readRecord();

        printNext(p);
        int64_t longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 1000);

        readMap(p);
        readArray(p);

        printNext(p);
        longval = p.readEnum();
        std::cout << "Enum choice " << longval << '\n';

        printNext(p);
        longval = p.readUnion();
        std::cout << "Union path " << longval << '\n';
        readMap(p);

        readNestedRecord(p);

        printNext(p);
        bool boolval = p.readBool();
        std::cout << boolval << '\n';
        BOOST_CHECK_EQUAL(boolval, true);

        printNext(p);
        readFixed(p);

        printNext(p);
        longval = p.readLong();
        std::cout << longval << '\n';
        BOOST_CHECK_EQUAL(longval, 7010728798977672067LL);

        printNext(p);
        int32_t intval = p.readInt();
        std::cout << intval << '\n';
        BOOST_CHECK_EQUAL(intval, -3456);
        p.readRecordEnd();
    }